

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

ReadFileResult
cmCMakePresetsGraphInternal::PresetVectorIntHelper
          (vector<int,_std::allocator<int>_> *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  Value *local_18;
  
  if (PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)::helper ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      PresetVectorIntHelper::helper.super__Function_base._M_functor._8_8_ = 0;
      PresetVectorIntHelper::helper.super__Function_base._M_functor._M_unused._M_object =
           operator_new(0x18);
      *(undefined8 *)PresetVectorIntHelper::helper.super__Function_base._M_functor._M_unused._0_8_ =
           0xa00000000;
      *(code **)((long)PresetVectorIntHelper::helper.super__Function_base._M_functor._M_unused._0_8_
                + 8) = PresetIntHelper;
      PresetVectorIntHelper::helper._M_invoker =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::vector<int,_std::allocator<int>_>_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:204:12)>
           ::_M_invoke;
      PresetVectorIntHelper::helper.super__Function_base._M_manager =
           std::
           _Function_handler<cmCMakePresetsGraph::ReadFileResult_(std::vector<int,_std::allocator<int>_>_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:204:12)>
           ::_M_manager;
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetVectorIntHelper::helper,&__dso_handle
                  );
      __cxa_guard_release(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*)
                           ::helper);
    }
  }
  local_18 = value;
  if (PresetVectorIntHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*PresetVectorIntHelper::helper._M_invoker)
                      ((_Any_data *)&PresetVectorIntHelper::helper,out,&local_18);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetVectorIntHelper(
  std::vector<int>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<int>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET, PresetIntHelper);

  return helper(out, value);
}